

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::AddCMakePaths(cmake *this)

{
  cmCacheManager *pcVar1;
  bool bVar2;
  char *pcVar3;
  string *__lhs;
  allocator local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  cmake *local_18;
  cmake *this_local;
  
  pcVar1 = this->CacheManager;
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_COMMAND",&local_39);
  cmSystemTools::GetCMakeCommand_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCacheManager::AddCacheEntry(pcVar1,&local_38,pcVar3,"Path to CMake executable.",INTERNAL);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = this->CacheManager;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"CMAKE_CTEST_COMMAND",&local_71);
  cmSystemTools::GetCTestCommand_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCacheManager::AddCacheEntry
            (pcVar1,&local_70,pcVar3,"Path to ctest program executable.",INTERNAL);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pcVar1 = this->CacheManager;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"CMAKE_CPACK_COMMAND",&local_99);
  cmSystemTools::GetCPackCommand_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCacheManager::AddCacheEntry
            (pcVar1,&local_98,pcVar3,"Path to cpack program executable.",INTERNAL);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  __lhs = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+(&local_c0,__lhs,"/Modules/CMake.cmake");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileExists(pcVar3);
  std::__cxx11::string::~string((string *)&local_c0);
  bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
  if (bVar2) {
    cmSystemTools::GetCMakeRoot_abi_cxx11_();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error
              ("Could not find CMAKE_ROOT !!!\nCMake has most likely not been installed correctly.\nModules directory not found in\n"
               ,pcVar3,(char *)0x0,(char *)0x0);
  }
  else {
    pcVar1 = this->CacheManager;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,"CMAKE_ROOT",&local_e1);
    cmSystemTools::GetCMakeRoot_abi_cxx11_();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCacheManager::AddCacheEntry(pcVar1,&local_e0,pcVar3,"Path to CMake installation.",INTERNAL);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  this_local._4_4_ = (uint)!bVar2;
  return this_local._4_4_;
}

Assistant:

int cmake::AddCMakePaths()
{
  // Save the value in the cache
  this->CacheManager->AddCacheEntry
    ("CMAKE_COMMAND", cmSystemTools::GetCMakeCommand().c_str(),
     "Path to CMake executable.", cmState::INTERNAL);
#ifdef CMAKE_BUILD_WITH_CMAKE
  this->CacheManager->AddCacheEntry
    ("CMAKE_CTEST_COMMAND", cmSystemTools::GetCTestCommand().c_str(),
     "Path to ctest program executable.", cmState::INTERNAL);
  this->CacheManager->AddCacheEntry
    ("CMAKE_CPACK_COMMAND", cmSystemTools::GetCPackCommand().c_str(),
     "Path to cpack program executable.", cmState::INTERNAL);
#endif
  if(!cmSystemTools::FileExists(
       (cmSystemTools::GetCMakeRoot()+"/Modules/CMake.cmake").c_str()))
    {
    // couldn't find modules
    cmSystemTools::Error("Could not find CMAKE_ROOT !!!\n"
      "CMake has most likely not been installed correctly.\n"
      "Modules directory not found in\n",
      cmSystemTools::GetCMakeRoot().c_str());
    return 0;
    }
  this->CacheManager->AddCacheEntry
    ("CMAKE_ROOT", cmSystemTools::GetCMakeRoot().c_str(),
     "Path to CMake installation.", cmState::INTERNAL);

  return 1;
}